

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2gal.cpp
# Opt level: O3

void PrintResults(CEExecOptions *opts,CESkyCoord *results)

{
  double dVar1;
  CEAngle CStack_68;
  CEDate local_58;
  
  putchar(10);
  puts("******************************************");
  puts("* Results of CIRS -> Galactic conversion *");
  puts("******************************************");
  puts("Galactic Coordinates (output)");
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_58,dVar1,JD);
  (*results->_vptr_CESkyCoord[3])(&CStack_68,results,&local_58);
  CEAngle::Deg(&CStack_68);
  printf("    Galactic Lon.: %f degrees\n");
  CEAngle::~CEAngle(&CStack_68);
  CEDate::~CEDate(&local_58);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_58,dVar1,JD);
  (*results->_vptr_CESkyCoord[4])(&CStack_68,results,&local_58);
  CEAngle::Deg(&CStack_68);
  printf("    Galactic Lat.: %+f degrees\n");
  CEAngle::~CEAngle(&CStack_68);
  CEDate::~CEDate(&local_58);
  puts("CIRS Coordinates (input)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"ra",(allocator *)&CStack_68);
  CLOptions::AsDouble(&opts->super_CLOptions,(string *)&local_58);
  printf("    Right Ascension: %f degrees\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"dec",(allocator *)&CStack_68);
  CLOptions::AsDouble(&opts->super_CLOptions,(string *)&local_58);
  printf("    Declination    : %+f degrees\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"juliandate",(allocator *)&CStack_68);
  CLOptions::AsDouble(&opts->super_CLOptions,(string *)&local_58);
  printf("    Julian Date    : %f\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  putchar(10);
  return;
}

Assistant:

void PrintResults(CEExecOptions&    opts, 
                  const CESkyCoord& results)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of CIRS -> Galactic conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("Galactic Coordinates (output)\n") ;
    std::printf("    Galactic Lon.: %f degrees\n", results.XCoord().Deg()) ;
    std::printf("    Galactic Lat.: %+f degrees\n", results.YCoord().Deg()) ;
    std::printf("CIRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %f degrees\n", opts.AsDouble("ra")) ;
    std::printf("    Declination    : %+f degrees\n", opts.AsDouble("dec")) ;
    std::printf("    Julian Date    : %f\n", opts.AsDouble("juliandate")) ;
    std::printf("\n") ;
}